

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

void __thiscall ON_OBSOLETE_V5_DimLinear::ON_OBSOLETE_V5_DimLinear(ON_OBSOLETE_V5_DimLinear *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  wchar_t *text_value;
  ON_OBSOLETE_V5_DimLinear *this_local;
  
  ON_OBSOLETE_V5_Annotation::ON_OBSOLETE_V5_Annotation(&this->super_ON_OBSOLETE_V5_Annotation);
  (this->super_ON_OBSOLETE_V5_Annotation).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b6fc60;
  (this->super_ON_OBSOLETE_V5_Annotation).m_type = dtDimLinear;
  (this->super_ON_OBSOLETE_V5_Annotation).m_textdisplaymode = kAboveLine;
  dVar1 = ON_xy_plane.plane_equation.d;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.plane_equation.z = ON_xy_plane.plane_equation.z;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.plane_equation.d = dVar1;
  dVar1 = ON_xy_plane.plane_equation.y;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.plane_equation.x = ON_xy_plane.plane_equation.x;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.plane_equation.y = dVar1;
  dVar1 = ON_xy_plane.zaxis.z;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis.y = ON_xy_plane.zaxis.y;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis.z = dVar1;
  dVar1 = ON_xy_plane.zaxis.x;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis.z = ON_xy_plane.yaxis.z;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis.x = dVar1;
  dVar7 = ON_xy_plane.yaxis.y;
  dVar6 = ON_xy_plane.xaxis.z;
  dVar5 = ON_xy_plane.xaxis.y;
  dVar4 = ON_xy_plane.xaxis.x;
  dVar3 = ON_xy_plane.origin.z;
  dVar2 = ON_xy_plane.origin.y;
  dVar1 = ON_xy_plane.origin.x;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis.x = ON_xy_plane.yaxis.x;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis.y = dVar7;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis.y = dVar5;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis.z = dVar6;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.z = dVar3;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis.x = dVar4;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.x = dVar1;
  (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.y = dVar2;
  text_value = DefaultText();
  ON_OBSOLETE_V5_Annotation::SetTextValue(&this->super_ON_OBSOLETE_V5_Annotation,text_value);
  ON_OBSOLETE_V5_Annotation::SetTextFormula(&this->super_ON_OBSOLETE_V5_Annotation,(wchar_t *)0x0);
  ON_SimpleArray<ON_2dPoint>::Reserve
            (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>,5);
  ON_SimpleArray<ON_2dPoint>::SetCount
            (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>,5);
  ON_SimpleArray<ON_2dPoint>::Zero
            (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>);
  return;
}

Assistant:

ON_OBSOLETE_V5_DimLinear::ON_OBSOLETE_V5_DimLinear()
{
  //ON_OBSOLETE_V5_DimExtra* pDE = new ON_OBSOLETE_V5_DimExtra;
  //if( pDE)
  //{
  //  if( !AttachUserData( pDE))
  //    delete pDE;
  //  else
  //    pDE->SetDefaults();
  //}

  m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear;
  m_textdisplaymode = ON_INTERNAL_OBSOLETE::V5_TextDisplayMode::kAboveLine;
  m_plane = ON_xy_plane;
  SetTextValue(DefaultText());
  SetTextFormula(0);
  m_points.Reserve(ON_OBSOLETE_V5_DimLinear::dim_pt_count);
  m_points.SetCount(ON_OBSOLETE_V5_DimLinear::dim_pt_count);
  m_points.Zero();
}